

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,H42 *hasher,int *dist_cache,size_t *last_insert_len,
               Command *commands,size_t *num_commands,size_t *num_literals)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  Command *pCVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  long lVar10;
  ulong uVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  ulong uVar14;
  ulong uVar15;
  uint8_t *puVar16;
  ulong uVar17;
  uint32_t uVar18;
  size_t sVar19;
  int *piVar20;
  DictionarySearchStatictics *pDVar21;
  uint8_t *local_cd0;
  uint8_t *local_cc0;
  uint8_t *local_cb0;
  uint8_t *local_c80;
  uint8_t *local_c78;
  ulong local_c70;
  ulong local_c68;
  uint8_t *local_c60;
  uint8_t *local_c58;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t distance_code;
  HasherSearchResult sr2;
  int is_match_found_2;
  size_t cost_diff_lazy;
  size_t sStack_bf0;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t max_backward_limit;
  H42 *hasher_local;
  BrotliEncoderParams *params_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_aa8;
  size_t nbits;
  size_t offset_2;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist_2;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_9b2;
  uint32_t nbits_2;
  ushort local_98a;
  uint16_t bits64;
  ushort local_96a;
  size_t score_4;
  size_t len_4;
  size_t last_1;
  size_t prev_ix_3;
  size_t slot_1;
  size_t delta_2;
  size_t hops_1;
  size_t backward_4;
  size_t bank_2;
  size_t score_3;
  size_t len_3;
  size_t prev_ix_2;
  size_t backward_3;
  size_t idx_2;
  uint8_t tiny_hash_1;
  size_t key_3;
  size_t i_2;
  size_t best_len_1;
  size_t best_score_1;
  int is_match_found_3;
  size_t cur_ix_masked_1;
  size_t matching_bits_4;
  uint64_t x_4;
  size_t limit2_4;
  size_t matched_4;
  ulong *local_858;
  size_t local_848;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_818;
  size_t local_808;
  size_t item_1;
  ulong uStack_7d0;
  int is_match_found_4;
  size_t i_3;
  size_t key_5;
  uint64_t t_19;
  uint64_t t_18;
  uint64_t t_17;
  uint64_t t_16;
  uint64_t t_23;
  uint64_t t_22;
  uint64_t t_21;
  uint64_t t_20;
  uint32_t h_5;
  size_t transform_id_1;
  size_t score_5;
  size_t backward_5;
  size_t matchlen_1;
  size_t offset_1;
  size_t dist_1;
  size_t len_5;
  size_t matching_bits_5;
  uint64_t x_5;
  size_t limit2_5;
  size_t matched_5;
  ulong *local_660;
  size_t local_650;
  uint64_t t_29;
  uint64_t t_28;
  uint64_t t_27;
  uint64_t t_26;
  uint32_t t_25;
  size_t score_1;
  size_t len_1;
  size_t last;
  size_t prev_ix_1;
  size_t slot;
  size_t delta;
  size_t hops;
  size_t backward_1;
  size_t bank;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t backward;
  size_t idx;
  uint8_t tiny_hash;
  size_t key;
  size_t i;
  size_t best_len;
  size_t best_score;
  int is_match_found;
  size_t cur_ix_masked;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_4d0;
  size_t local_4c0;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_490;
  size_t local_480;
  size_t item;
  ulong uStack_448;
  int is_match_found_1;
  size_t i_1;
  size_t key_2;
  uint64_t t_4;
  uint64_t t_3;
  uint64_t t_2;
  uint64_t t_1;
  uint64_t t_8;
  uint64_t t_7;
  uint64_t t_6;
  uint64_t t_5;
  uint32_t h_2;
  size_t transform_id;
  size_t score_2;
  size_t backward_2;
  size_t matchlen;
  size_t offset;
  size_t dist;
  size_t len_2;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_2d8;
  size_t local_2c8;
  uint64_t t_14;
  uint64_t t_13;
  uint64_t t_12;
  uint64_t t_11;
  uint32_t t_10;
  uint8_t *local_258;
  size_t i_4;
  ulong local_228;
  size_t delta_4;
  size_t idx_4;
  size_t bank_4;
  size_t key_6;
  ulong local_1e8;
  size_t delta_1;
  size_t idx_1;
  size_t bank_1;
  size_t key_1;
  ulong local_1a8;
  size_t delta_3;
  size_t idx_3;
  size_t bank_3;
  size_t key_4;
  ulong local_168;
  size_t delta_6;
  size_t idx_6;
  size_t bank_6;
  size_t key_8;
  ulong local_128;
  size_t delta_5;
  size_t idx_5;
  size_t bank_5;
  size_t key_7;
  uint32_t h_7;
  uint32_t t_31;
  uint32_t h_8;
  uint32_t t_32;
  uint32_t h_4;
  uint32_t t_24;
  uint32_t h_1;
  uint32_t t_9;
  uint32_t h_6;
  uint32_t t_30;
  uint32_t h;
  uint32_t t;
  uint32_t h_3;
  uint32_t t_15;
  
  pCVar4 = commands;
  puVar8 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  pos_end = *last_insert_len;
  puVar9 = (uint8_t *)(position + num_bytes);
  local_c58 = (uint8_t *)position;
  if (3 < num_bytes) {
    local_c58 = (uint8_t *)((position + num_bytes) - 3);
  }
  iVar7 = 0x200;
  if (params->quality < 9) {
    iVar7 = 0x40;
  }
  lVar10 = (long)iVar7;
  kMinScore = position + lVar10;
  puVar12 = (uint8_t *)position;
LAB_0012015c:
  do {
    ringbuffer_local = puVar12;
    if (puVar9 <= ringbuffer_local + 4) {
      *last_insert_len = (size_t)(puVar9 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar4 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar9 - (long)ringbuffer_local;
    local_c60 = puVar8;
    if (ringbuffer_local < puVar8) {
      local_c60 = ringbuffer_local;
    }
    sr.len_x_code = 0;
    sr.distance = 0x1f90;
    uVar11 = (ulong)ringbuffer_local & ringbuffer_mask;
    bVar2 = false;
    best_len = 0x1f90;
    i = 0;
    uVar5 = (uint)(*(int *)(ringbuffer + uVar11) * 0x1e35a7bd) >> 0x11;
    uVar17 = (ulong)uVar5;
    sStack_bf0 = 0;
    sr.len = 0;
    for (key = 0; key < 0x10; key = key + 1) {
      puVar12 = (uint8_t *)(long)(dist_cache[kDistanceCacheIndex[key]] + kDistanceCacheOffset[key]);
      puVar13 = ringbuffer_local + -(long)puVar12;
      if ((((key == 0) || (hasher->tiny_hash[(ulong)puVar13 & 0xffff] == (uint8_t)uVar5)) &&
          (puVar13 < ringbuffer_local)) && (puVar12 <= local_c60)) {
        uVar14 = ringbuffer_mask & (ulong)puVar13;
        local_490 = (ulong *)(ringbuffer + uVar11);
        limit2 = 0;
        x = (max_distance >> 3) + 1;
LAB_00120459:
        x = x - 1;
        if (x != 0) {
          if (*local_490 == *(ulong *)(ringbuffer + limit2 + uVar14)) goto LAB_001204d7;
          iVar7 = 0;
          for (uVar14 = *local_490 ^ *(ulong *)(ringbuffer + limit2 + uVar14); (uVar14 & 1) == 0;
              uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            iVar7 = iVar7 + 1;
          }
          local_480 = ((ulong)(long)iVar7 >> 3) + limit2;
          goto LAB_00120634;
        }
        matched = (max_distance & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (ringbuffer[limit2 + uVar14] != (uint8_t)*local_490) {
            local_480 = limit2;
            goto LAB_00120634;
          }
          local_490 = (ulong *)((long)local_490 + 1);
          limit2 = limit2 + 1;
        }
        local_480 = limit2;
LAB_00120634:
        if ((1 < local_480) &&
           (uVar14 = local_480 * 0x21c + kDistanceShortCodeCost[key], best_len < uVar14)) {
          i = local_480;
          sStack_bf0 = local_480;
          bVar2 = true;
          sr.len_x_code = (size_t)puVar12;
          sr.distance = uVar14;
          best_len = uVar14;
        }
      }
    }
    hops = 0;
    slot = (long)ringbuffer_local - (ulong)hasher->addr[uVar17];
    prev_ix_1 = (ulong)hasher->head[uVar17];
    delta = hasher->max_hops;
    while ((sVar19 = delta - 1, delta != 0 && (hops = slot + hops, hops <= local_c60))) {
      uVar14 = (long)ringbuffer_local - hops & ringbuffer_mask;
      uVar15 = (ulong)hasher->banks[uVar17 & 0x1ff].slots[prev_ix_1].next;
      slot = (size_t)hasher->banks[uVar17 & 0x1ff].slots[prev_ix_1].delta;
      prev_ix_1 = uVar15;
      delta = sVar19;
      if ((uVar11 + i <= ringbuffer_mask) &&
         ((uVar14 + i <= ringbuffer_mask && (ringbuffer[uVar11 + i] == ringbuffer[uVar14 + i])))) {
        local_4d0 = (ulong *)(ringbuffer + uVar11);
        limit2_1 = 0;
        x_1 = (max_distance >> 3) + 1;
LAB_00120919:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          if (*local_4d0 == *(ulong *)(ringbuffer + limit2_1 + uVar14)) goto LAB_00120997;
          iVar7 = 0;
          for (uVar14 = *local_4d0 ^ *(ulong *)(ringbuffer + limit2_1 + uVar14); (uVar14 & 1) == 0;
              uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            iVar7 = iVar7 + 1;
          }
          local_4c0 = ((ulong)(long)iVar7 >> 3) + limit2_1;
          goto LAB_00120af4;
        }
        matched_1 = (max_distance & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (ringbuffer[limit2_1 + uVar14] != (uint8_t)*local_4d0) {
            local_4c0 = limit2_1;
            goto LAB_00120af4;
          }
          local_4d0 = (ulong *)((long)local_4d0 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_4c0 = limit2_1;
LAB_00120af4:
        if (3 < local_4c0) {
          iVar7 = 0x1f;
          if ((uint)hops != 0) {
            for (; (uint)hops >> iVar7 == 0; iVar7 = iVar7 + -1) {
            }
          }
          uVar14 = (local_4c0 * 0x21c + 0x1e00) - (ulong)(uint)(iVar7 * 0x78);
          if (best_len < uVar14) {
            i = local_4c0;
            sStack_bf0 = local_4c0;
            bVar2 = true;
            sr.len_x_code = hops;
            sr.distance = uVar14;
            best_len = uVar14;
          }
        }
      }
    }
    uVar5 = (uint)(*(int *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask)) * 0x1e35a7bd)
            >> 0x11;
    uVar17 = (ulong)uVar5;
    uVar14 = uVar17 & 0x1ff;
    uVar1 = hasher->free_slot_idx[uVar14];
    hasher->free_slot_idx[uVar14] = uVar1 + 1;
    uVar6 = uVar1 & 0x1ff;
    local_1e8 = (long)ringbuffer_local - (ulong)hasher->addr[uVar17];
    hasher->tiny_hash[(ulong)ringbuffer_local & 0xffff] = (uint8_t)uVar5;
    if (0xffff < local_1e8) {
      local_1e8 = 0xffff;
    }
    hasher->banks[uVar14].slots[(int)uVar6].delta = (uint16_t)local_1e8;
    hasher->banks[uVar14].slots[(int)uVar6].next = hasher->head[uVar17];
    hasher->addr[uVar17] = (uint32_t)ringbuffer_local;
    hasher->head[uVar17] = (uint16_t)uVar6;
    if (!bVar2) {
      pDVar21 = &hasher->dict_search_stats_;
      piVar20 = (int *)(ringbuffer + uVar11);
      bVar2 = false;
      if ((hasher->dict_search_stats_).num_matches < pDVar21->num_lookups >> 7) {
        bVar2 = false;
      }
      else {
        i_1 = (size_t)(((uint)(*piVar20 * 0x1e35a7bd) >> 0x12) << 1);
        for (uStack_448 = 0; uStack_448 < 2; uStack_448 = uStack_448 + 1) {
          uVar1 = kStaticDictionaryHash[i_1];
          uVar11 = (ulong)uVar1;
          pDVar21->num_lookups = pDVar21->num_lookups + 1;
          if (uVar11 != 0) {
            uVar17 = uVar11 & 0x1f;
            uVar14 = (ulong)(uVar1 >> 5);
            if (max_distance < uVar17) {
              bVar3 = false;
            }
            else {
              local_2d8 = (ulong *)(&kBrotliDictionary +
                                   (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength + uVar17 * 4)
                                   + uVar17 * uVar14);
              limit2_2 = 0;
              x_2 = (uVar17 >> 3) + 1;
LAB_00121007:
              x_2 = x_2 - 1;
              if (x_2 != 0) {
                if (*local_2d8 == *(ulong *)((long)piVar20 + limit2_2)) goto LAB_00121085;
                iVar7 = 0;
                for (uVar11 = *local_2d8 ^ *(ulong *)((long)piVar20 + limit2_2); (uVar11 & 1) == 0;
                    uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                  iVar7 = iVar7 + 1;
                }
                local_2c8 = ((ulong)(long)iVar7 >> 3) + limit2_2;
                goto LAB_001211e2;
              }
              matched_2 = (uVar11 & 7) + 1;
              while (matched_2 = matched_2 - 1, matched_2 != 0) {
                if (*(char *)((long)piVar20 + limit2_2) != (char)*local_2d8) {
                  local_2c8 = limit2_2;
                  goto LAB_001211e2;
                }
                local_2d8 = (ulong *)((long)local_2d8 + 1);
                limit2_2 = limit2_2 + 1;
              }
              local_2c8 = limit2_2;
LAB_001211e2:
              if ((uVar17 < local_2c8 + 10) && (local_2c8 != 0)) {
                iVar7 = 0x1f;
                uVar5 = (uint)(local_c60 +
                              ((ulong)""[uVar17 - local_2c8] <<
                              ((&kBrotliDictionarySizeBitsByLength)[uVar17] & 0x3f)) + uVar14 + 1);
                if (uVar5 != 0) {
                  for (; uVar5 >> iVar7 == 0; iVar7 = iVar7 + -1) {
                  }
                }
                uVar11 = (local_2c8 * 0x21c + 0x1e00) - (ulong)(uint)(iVar7 * 0x78);
                if (uVar11 < sr.distance) {
                  bVar3 = false;
                }
                else {
                  sStack_bf0 = local_2c8;
                  sr.len = uVar17 ^ local_2c8;
                  bVar3 = true;
                  sr.len_x_code =
                       (size_t)(local_c60 +
                               ((ulong)""[uVar17 - local_2c8] <<
                               ((&kBrotliDictionarySizeBitsByLength)[uVar17] & 0x3f)) + uVar14 + 1);
                  sr.distance = uVar11;
                }
              }
              else {
                bVar3 = false;
              }
            }
            if (bVar3) {
              (hasher->dict_search_stats_).num_matches =
                   (hasher->dict_search_stats_).num_matches + 1;
              bVar2 = true;
            }
          }
          i_1 = i_1 + 1;
        }
      }
    }
    if (bVar2) {
      cost_diff_lazy._4_4_ = 0;
      do {
        max_distance = max_distance - 1;
        if (params->quality < 5) {
          local_c68 = sStack_bf0 - 1;
          if (max_distance <= local_c68) {
            local_c68 = max_distance;
          }
          local_c70 = local_c68;
        }
        else {
          local_c70 = 0;
        }
        sr2.len_x_code = 0;
        sr2.distance = 0x1f90;
        local_c78 = puVar8;
        if (ringbuffer_local + 1 < puVar8) {
          local_c78 = ringbuffer_local + 1;
        }
        puVar12 = ringbuffer_local + 1;
        uVar11 = (ulong)puVar12 & ringbuffer_mask;
        bVar2 = false;
        best_len_1 = 0x1f90;
        i_2 = local_c70;
        uVar5 = (uint)(*(int *)(ringbuffer + uVar11) * 0x1e35a7bd) >> 0x11;
        uVar17 = (ulong)uVar5;
        distance_code = 0;
        sr2.len = 0;
        for (key_3 = 0; key_3 < 0x10; key_3 = key_3 + 1) {
          puVar13 = (uint8_t *)
                    (long)(dist_cache[kDistanceCacheIndex[key_3]] + kDistanceCacheOffset[key_3]);
          puVar16 = puVar12 + -(long)puVar13;
          if ((((key_3 == 0) || (hasher->tiny_hash[(ulong)puVar16 & 0xffff] == (uint8_t)uVar5)) &&
              (puVar16 < puVar12)) && (puVar13 <= local_c78)) {
            uVar14 = ringbuffer_mask & (ulong)puVar16;
            local_818 = (ulong *)(ringbuffer + uVar11);
            limit2_3 = 0;
            x_3 = (max_distance >> 3) + 1;
LAB_00121738:
            x_3 = x_3 - 1;
            if (x_3 != 0) {
              if (*local_818 == *(ulong *)(ringbuffer + limit2_3 + uVar14)) goto LAB_001217b6;
              iVar7 = 0;
              for (uVar14 = *local_818 ^ *(ulong *)(ringbuffer + limit2_3 + uVar14);
                  (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                iVar7 = iVar7 + 1;
              }
              local_808 = ((ulong)(long)iVar7 >> 3) + limit2_3;
              goto LAB_00121913;
            }
            matched_3 = (max_distance & 7) + 1;
            while (matched_3 = matched_3 - 1, matched_3 != 0) {
              if (ringbuffer[limit2_3 + uVar14] != (uint8_t)*local_818) {
                local_808 = limit2_3;
                goto LAB_00121913;
              }
              local_818 = (ulong *)((long)local_818 + 1);
              limit2_3 = limit2_3 + 1;
            }
            local_808 = limit2_3;
LAB_00121913:
            if ((1 < local_808) &&
               (uVar14 = local_808 * 0x21c + kDistanceShortCodeCost[key_3], best_len_1 < uVar14)) {
              i_2 = local_808;
              distance_code = local_808;
              bVar2 = true;
              sr2.len_x_code = (size_t)puVar13;
              sr2.distance = uVar14;
              best_len_1 = uVar14;
            }
          }
        }
        hops_1 = 0;
        slot_1 = (long)puVar12 - (ulong)hasher->addr[uVar17];
        prev_ix_3 = (ulong)hasher->head[uVar17];
        delta_2 = hasher->max_hops;
        while ((sVar19 = delta_2 - 1, delta_2 != 0 &&
               (hops_1 = slot_1 + hops_1, hops_1 <= local_c78))) {
          uVar14 = (long)puVar12 - hops_1 & ringbuffer_mask;
          uVar15 = (ulong)hasher->banks[uVar17 & 0x1ff].slots[prev_ix_3].next;
          slot_1 = (size_t)hasher->banks[uVar17 & 0x1ff].slots[prev_ix_3].delta;
          prev_ix_3 = uVar15;
          delta_2 = sVar19;
          if ((uVar11 + i_2 <= ringbuffer_mask) &&
             ((uVar14 + i_2 <= ringbuffer_mask &&
              (ringbuffer[uVar11 + i_2] == ringbuffer[uVar14 + i_2])))) {
            local_858 = (ulong *)(ringbuffer + uVar11);
            limit2_4 = 0;
            x_4 = (max_distance >> 3) + 1;
LAB_00121bf8:
            x_4 = x_4 - 1;
            if (x_4 != 0) {
              if (*local_858 == *(ulong *)(ringbuffer + limit2_4 + uVar14)) goto LAB_00121c76;
              iVar7 = 0;
              for (uVar14 = *local_858 ^ *(ulong *)(ringbuffer + limit2_4 + uVar14);
                  (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                iVar7 = iVar7 + 1;
              }
              local_848 = ((ulong)(long)iVar7 >> 3) + limit2_4;
              goto LAB_00121dd3;
            }
            matched_4 = (max_distance & 7) + 1;
            while (matched_4 = matched_4 - 1, matched_4 != 0) {
              if (ringbuffer[limit2_4 + uVar14] != (uint8_t)*local_858) {
                local_848 = limit2_4;
                goto LAB_00121dd3;
              }
              local_858 = (ulong *)((long)local_858 + 1);
              limit2_4 = limit2_4 + 1;
            }
            local_848 = limit2_4;
LAB_00121dd3:
            if (3 < local_848) {
              iVar7 = 0x1f;
              if ((uint)hops_1 != 0) {
                for (; (uint)hops_1 >> iVar7 == 0; iVar7 = iVar7 + -1) {
                }
              }
              uVar14 = (local_848 * 0x21c + 0x1e00) - (ulong)(uint)(iVar7 * 0x78);
              if (best_len_1 < uVar14) {
                i_2 = local_848;
                distance_code = local_848;
                bVar2 = true;
                sr2.len_x_code = hops_1;
                sr2.distance = uVar14;
                best_len_1 = uVar14;
              }
            }
          }
        }
        uVar5 = (uint)(*(int *)(ringbuffer + ((ulong)puVar12 & ringbuffer_mask)) * 0x1e35a7bd) >>
                0x11;
        uVar17 = (ulong)uVar5;
        uVar14 = uVar17 & 0x1ff;
        uVar1 = hasher->free_slot_idx[uVar14];
        hasher->free_slot_idx[uVar14] = uVar1 + 1;
        uVar6 = uVar1 & 0x1ff;
        local_1a8 = (long)puVar12 - (ulong)hasher->addr[uVar17];
        hasher->tiny_hash[(ulong)puVar12 & 0xffff] = (uint8_t)uVar5;
        if (0xffff < local_1a8) {
          local_1a8 = 0xffff;
        }
        hasher->banks[uVar14].slots[(int)uVar6].delta = (uint16_t)local_1a8;
        hasher->banks[uVar14].slots[(int)uVar6].next = hasher->head[uVar17];
        hasher->addr[uVar17] = (uint32_t)puVar12;
        hasher->head[uVar17] = (uint16_t)uVar6;
        if (!bVar2) {
          pDVar21 = &hasher->dict_search_stats_;
          piVar20 = (int *)(ringbuffer + uVar11);
          bVar2 = false;
          if ((hasher->dict_search_stats_).num_matches < pDVar21->num_lookups >> 7) {
            bVar2 = false;
          }
          else {
            i_3 = (size_t)(((uint)(*piVar20 * 0x1e35a7bd) >> 0x12) << 1);
            for (uStack_7d0 = 0; uStack_7d0 < 2; uStack_7d0 = uStack_7d0 + 1) {
              uVar1 = kStaticDictionaryHash[i_3];
              uVar11 = (ulong)uVar1;
              pDVar21->num_lookups = pDVar21->num_lookups + 1;
              if (uVar11 != 0) {
                uVar17 = uVar11 & 0x1f;
                uVar14 = (ulong)(uVar1 >> 5);
                if (max_distance < uVar17) {
                  bVar3 = false;
                }
                else {
                  local_660 = (ulong *)(&kBrotliDictionary +
                                       (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength +
                                                       uVar17 * 4) + uVar17 * uVar14);
                  limit2_5 = 0;
                  x_5 = (uVar17 >> 3) + 1;
LAB_001222fe:
                  x_5 = x_5 - 1;
                  if (x_5 != 0) {
                    if (*local_660 == *(ulong *)((long)piVar20 + limit2_5)) goto LAB_0012237c;
                    iVar7 = 0;
                    for (uVar11 = *local_660 ^ *(ulong *)((long)piVar20 + limit2_5);
                        (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                      iVar7 = iVar7 + 1;
                    }
                    local_650 = ((ulong)(long)iVar7 >> 3) + limit2_5;
                    goto LAB_001224d9;
                  }
                  matched_5 = (uVar11 & 7) + 1;
                  while (matched_5 = matched_5 - 1, matched_5 != 0) {
                    if (*(char *)((long)piVar20 + limit2_5) != (char)*local_660) {
                      local_650 = limit2_5;
                      goto LAB_001224d9;
                    }
                    local_660 = (ulong *)((long)local_660 + 1);
                    limit2_5 = limit2_5 + 1;
                  }
                  local_650 = limit2_5;
LAB_001224d9:
                  if ((uVar17 < local_650 + 10) && (local_650 != 0)) {
                    iVar7 = 0x1f;
                    uVar5 = (uint)(local_c78 +
                                  ((ulong)""[uVar17 - local_650] <<
                                  ((&kBrotliDictionarySizeBitsByLength)[uVar17] & 0x3f)) +
                                  uVar14 + 1);
                    if (uVar5 != 0) {
                      for (; uVar5 >> iVar7 == 0; iVar7 = iVar7 + -1) {
                      }
                    }
                    uVar11 = (local_650 * 0x21c + 0x1e00) - (ulong)(uint)(iVar7 * 0x78);
                    if (uVar11 < sr2.distance) {
                      bVar3 = false;
                    }
                    else {
                      distance_code = local_650;
                      sr2.len = uVar17 ^ local_650;
                      bVar3 = true;
                      sr2.len_x_code =
                           (size_t)(local_c78 +
                                   ((ulong)""[uVar17 - local_650] <<
                                   ((&kBrotliDictionarySizeBitsByLength)[uVar17] & 0x3f)) +
                                   uVar14 + 1);
                      sr2.distance = uVar11;
                    }
                  }
                  else {
                    bVar3 = false;
                  }
                }
                if (bVar3) {
                  (hasher->dict_search_stats_).num_matches =
                       (hasher->dict_search_stats_).num_matches + 1;
                  bVar2 = true;
                }
              }
              i_3 = i_3 + 1;
            }
          }
        }
        puVar12 = ringbuffer_local;
        if ((!bVar2) || (sr2.distance < sr.distance + 700)) goto LAB_00122769;
        puVar12 = ringbuffer_local + 1;
        pos_end = pos_end + 1;
        sStack_bf0 = distance_code;
        sr.len = sr2.len;
        sr.len_x_code = sr2.len_x_code;
        sr.distance = sr2.distance;
        cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1;
        if ((3 < cost_diff_lazy._4_4_) ||
           (puVar13 = ringbuffer_local + 5, ringbuffer_local = puVar12, puVar9 <= puVar13))
        goto LAB_00122769;
      } while( true );
    }
    pos_end = pos_end + 1;
    puVar12 = ringbuffer_local + 1;
    if (kMinScore < puVar12) {
      if ((uint8_t *)(kMinScore + lVar10 * 4) < puVar12) {
        puVar13 = ringbuffer_local + 0x11;
        local_cc0 = puVar9 + -4;
        ringbuffer_local = puVar12;
        if (puVar13 < local_cc0) {
          local_cc0 = puVar13;
        }
        for (; puVar12 = ringbuffer_local, ringbuffer_local < local_cc0;
            ringbuffer_local = ringbuffer_local + 4) {
          uVar5 = (uint)(*(int *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask)) *
                        0x1e35a7bd) >> 0x11;
          uVar11 = (ulong)uVar5;
          uVar17 = uVar11 & 0x1ff;
          uVar1 = hasher->free_slot_idx[uVar17];
          hasher->free_slot_idx[uVar17] = uVar1 + 1;
          uVar6 = uVar1 & 0x1ff;
          local_128 = (long)ringbuffer_local - (ulong)hasher->addr[uVar11];
          hasher->tiny_hash[(ulong)ringbuffer_local & 0xffff] = (uint8_t)uVar5;
          if (0xffff < local_128) {
            local_128 = 0xffff;
          }
          hasher->banks[uVar17].slots[(int)uVar6].delta = (uint16_t)local_128;
          hasher->banks[uVar17].slots[(int)uVar6].next = hasher->head[uVar11];
          hasher->addr[uVar11] = (uint32_t)ringbuffer_local;
          hasher->head[uVar11] = (uint16_t)uVar6;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar13 = ringbuffer_local + 9;
        local_cd0 = puVar9 + -3;
        ringbuffer_local = puVar12;
        if (puVar13 < local_cd0) {
          local_cd0 = puVar13;
        }
        for (; puVar12 = ringbuffer_local, ringbuffer_local < local_cd0;
            ringbuffer_local = ringbuffer_local + 2) {
          uVar5 = (uint)(*(int *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask)) *
                        0x1e35a7bd) >> 0x11;
          uVar11 = (ulong)uVar5;
          uVar17 = uVar11 & 0x1ff;
          uVar1 = hasher->free_slot_idx[uVar17];
          hasher->free_slot_idx[uVar17] = uVar1 + 1;
          uVar6 = uVar1 & 0x1ff;
          local_168 = (long)ringbuffer_local - (ulong)hasher->addr[uVar11];
          hasher->tiny_hash[(ulong)ringbuffer_local & 0xffff] = (uint8_t)uVar5;
          if (0xffff < local_168) {
            local_168 = 0xffff;
          }
          hasher->banks[uVar17].slots[(int)uVar6].delta = (uint16_t)local_168;
          hasher->banks[uVar17].slots[(int)uVar6].next = hasher->head[uVar11];
          hasher->addr[uVar11] = (uint32_t)ringbuffer_local;
          hasher->head[uVar11] = (uint16_t)uVar6;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
LAB_001204d7:
  local_490 = local_490 + 1;
  limit2 = limit2 + 8;
  goto LAB_00120459;
LAB_00120997:
  local_4d0 = local_4d0 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_00120919;
LAB_00121085:
  local_2d8 = local_2d8 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_00121007;
LAB_001217b6:
  local_818 = local_818 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_00121738;
LAB_00121c76:
  local_858 = local_858 + 1;
  limit2_4 = limit2_4 + 8;
  goto LAB_00121bf8;
LAB_0012237c:
  local_660 = local_660 + 1;
  limit2_5 = limit2_5 + 8;
  goto LAB_001222fe;
LAB_00122769:
  ringbuffer_local = puVar12;
  kMinScore = (size_t)(ringbuffer_local + lVar10 + sStack_bf0 * 2);
  local_c80 = puVar8;
  if (ringbuffer_local < puVar8) {
    local_c80 = ringbuffer_local;
  }
  if (sr.len_x_code <= local_c80) {
    uVar11 = (sr.len_x_code + 3) - (long)*dist_cache;
    uVar17 = (sr.len_x_code + 3) - (long)dist_cache[1];
    if (sr.len_x_code == (long)*dist_cache) {
      local_aa8 = 0;
      goto LAB_00122988;
    }
    if (sr.len_x_code == (long)dist_cache[1]) {
      local_aa8 = 1;
      goto LAB_00122988;
    }
    if (uVar11 < 7) {
      local_aa8 = (ulong)(int)(0x9750468 >> ((byte)((uVar11 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_00122988;
    }
    if (uVar17 < 7) {
      local_aa8 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar17 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_00122988;
    }
    if (sr.len_x_code == (long)dist_cache[2]) {
      local_aa8 = 2;
      goto LAB_00122988;
    }
    if (sr.len_x_code == (long)dist_cache[3]) {
      local_aa8 = 3;
      goto LAB_00122988;
    }
  }
  local_aa8 = sr.len_x_code + 0xf;
LAB_00122988:
  if ((sr.len_x_code <= local_c80) && (local_aa8 != 0)) {
    dist_cache[3] = dist_cache[2];
    dist_cache[2] = dist_cache[1];
    dist_cache[1] = *dist_cache;
    *dist_cache = (int)sr.len_x_code;
  }
  uVar11 = sStack_bf0 ^ sr.len;
  uVar18 = (uint32_t)pos_end;
  commands->insert_len_ = uVar18;
  commands->copy_len_ = (uint)sStack_bf0 | (uint)(sr.len << 0x18);
  if (local_aa8 < 0x10) {
    commands->dist_prefix_ = (uint16_t)local_aa8;
    commands->dist_extra_ = 0;
  }
  else {
    iVar7 = 0x1f;
    uVar5 = (uint)(local_aa8 - 0xc);
    if (uVar5 != 0) {
      for (; uVar5 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    iVar7 = iVar7 + -1;
    uVar17 = local_aa8 - 0xc >> ((byte)iVar7 & 0x3f) & 1;
    commands->dist_prefix_ = ((short)iVar7 + -1) * 2 + (short)uVar17 + 0x10;
    commands->dist_extra_ = iVar7 * 0x1000000 | uVar5 - (int)(uVar17 + 2 << ((byte)iVar7 & 0x3f));
  }
  if (pos_end < 6) {
    local_9b2 = (ushort)pos_end;
  }
  else if (pos_end < 0x82) {
    iVar7 = 0x1f;
    if (uVar18 - 2 != 0) {
      for (; uVar18 - 2 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    local_9b2 = (short)(iVar7 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar7 + -1) & 0x3f)) + 2;
  }
  else if (pos_end < 0x842) {
    iVar7 = 0x1f;
    if (uVar18 - 0x42 != 0) {
      for (; uVar18 - 0x42 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    local_9b2 = (short)iVar7 + 10;
  }
  else if (pos_end < 0x1842) {
    local_9b2 = 0x15;
  }
  else if (pos_end < 0x5842) {
    local_9b2 = 0x16;
  }
  else {
    local_9b2 = 0x17;
  }
  if (uVar11 < 10) {
    local_98a = (short)uVar11 - 2;
  }
  else if (uVar11 < 0x86) {
    uVar5 = (int)uVar11 - 6;
    iVar7 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    local_98a = (short)(iVar7 + -1) * 2 + (short)(uVar11 - 6 >> ((byte)(iVar7 + -1) & 0x3f)) + 4;
  }
  else if (uVar11 < 0x846) {
    uVar5 = (int)uVar11 - 0x46;
    iVar7 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    local_98a = (short)iVar7 + 0xc;
  }
  else {
    local_98a = 0x17;
  }
  local_96a = local_98a & 7 | (local_9b2 & 7) << 3;
  if (((commands->dist_prefix_ == 0) && (local_9b2 < 8)) && (local_98a < 0x10)) {
    if (7 < local_98a) {
      local_96a = local_96a | 0x40;
    }
  }
  else {
    local_96a = *(ushort *)
                 (CombineLengthCodes_cells +
                 (long)(((int)(uint)local_98a >> 3) + ((int)(uint)local_9b2 >> 3) * 3) * 2) |
                local_96a;
  }
  commands->cmd_prefix_ = local_96a;
  *num_literals = pos_end + *num_literals;
  pos_end = 0;
  local_258 = ringbuffer_local + 2;
  local_cb0 = ringbuffer_local + sStack_bf0;
  if (local_c58 <= local_cb0) {
    local_cb0 = local_c58;
  }
  for (; local_258 < local_cb0; local_258 = local_258 + 1) {
    uVar5 = (uint)(*(int *)(ringbuffer + ((ulong)local_258 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11
    ;
    uVar11 = (ulong)uVar5;
    uVar17 = uVar11 & 0x1ff;
    uVar1 = hasher->free_slot_idx[uVar17];
    hasher->free_slot_idx[uVar17] = uVar1 + 1;
    uVar6 = uVar1 & 0x1ff;
    local_228 = (long)local_258 - (ulong)hasher->addr[uVar11];
    hasher->tiny_hash[(ulong)local_258 & 0xffff] = (uint8_t)uVar5;
    if (0xffff < local_228) {
      local_228 = 0xffff;
    }
    hasher->banks[uVar17].slots[(int)uVar6].delta = (uint16_t)local_228;
    hasher->banks[uVar17].slots[(int)uVar6].next = hasher->head[uVar11];
    hasher->addr[uVar11] = (uint32_t)local_258;
    hasher->head[uVar11] = (uint16_t)uVar6;
  }
  commands = commands + 1;
  puVar12 = ringbuffer_local + sStack_bf0;
  goto LAB_0012015c;
}

Assistant:

static BROTLI_NOINLINE void FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, Hasher* hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 400;

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_x_code = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    if (FN(FindLongestMatch)(hasher, ringbuffer, ringbuffer_mask, dist_cache,
                             position, max_length, max_distance, &sr)) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 700;
        BROTLI_BOOL is_match_found;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_x_code = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        is_match_found = FN(FindLongestMatch)(hasher, ringbuffer,
            ringbuffer_mask, dist_cache, position + 1, max_length, max_distance,
            &sr2);
        if (is_match_found && sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance, dist_cache);
        if (sr.distance <= max_distance && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
        }
        InitCommand(commands++, insert_length, sr.len, sr.len ^ sr.len_x_code,
            distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them. */
      FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, position + 2,
                     BROTLI_MIN(size_t, position + sr.len, store_end));
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}